

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<float> * __thiscall
cimg_library::CImg<float>::resize
          (CImg<float> *this,int size_x,int size_y,int size_z,int size_c,int interpolation_type,
          uint boundary_conditions,float centering_x,float centering_y,float centering_z,
          float centering_c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  CImg<float> *pCVar5;
  uint size_y_00;
  uint size_x_00;
  uint size_z_00;
  uint size_c_00;
  CImg<float> CStack_48;
  
  if ((size_z == 0 || (size_y == 0 || size_x == 0)) || size_c == 0) {
    if ((this->_is_shared == false) && (this->_data != (float *)0x0)) {
      operator_delete__(this->_data);
    }
    this->_data = (float *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
    this->_is_shared = false;
  }
  else {
    if (size_x < 0) {
      size_x = (int)-(size_x * this->_width) / 100;
    }
    if (size_y < 0) {
      size_y = (int)-(size_y * this->_height) / 100;
    }
    if (size_z < 0) {
      size_z = (int)-(size_z * this->_depth) / 100;
    }
    uVar1 = this->_spectrum;
    if (size_c < 0) {
      size_c = (int)-(size_c * uVar1) / 100;
    }
    size_x_00 = size_x + (uint)(size_x == 0);
    size_y_00 = size_y + (uint)(size_y == 0);
    size_z_00 = size_z + (uint)(size_z == 0);
    size_c_00 = size_c + (uint)(size_c == 0);
    uVar2 = this->_width;
    uVar3 = this->_height;
    uVar4 = this->_depth;
    if ((((size_x_00 != uVar2) || (size_y_00 != uVar3)) || (size_z_00 != uVar4)) ||
       (size_c_00 != uVar1)) {
      if (uVar1 == 0 ||
          ((uVar4 == 0 || uVar3 == 0) || ((ulong)uVar2 == 0 || this->_data == (float *)0x0))) {
        pCVar5 = assign(this,size_x_00,size_y_00,size_z_00,size_c_00);
        pCVar5 = fill(pCVar5,0.0);
        return pCVar5;
      }
      if (interpolation_type == -1) {
        if ((ulong)uVar4 * (ulong)uVar1 * (ulong)uVar3 * (ulong)uVar2 -
            (ulong)(size_z_00 * size_c_00 * size_y_00 * size_x_00) == 0) {
          this->_width = size_x_00;
          this->_height = size_y_00;
          this->_depth = size_z_00;
          this->_spectrum = size_c_00;
          return this;
        }
        interpolation_type = -1;
      }
      get_resize(&CStack_48,this,size_x_00,size_y_00,size_z_00,size_c_00,interpolation_type,
                 boundary_conditions,centering_x,centering_y,centering_z,centering_c);
      this = move_to(&CStack_48,this);
      if ((CStack_48._is_shared == false) && (CStack_48._data != (float *)0x0)) {
        operator_delete__(CStack_48._data);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& resize(const int size_x, const int size_y=-100,
                    const int size_z=-100, const int size_c=-100,
                    const int interpolation_type=1, const unsigned int boundary_conditions=0,
                    const float centering_x = 0, const float centering_y = 0,
                    const float centering_z = 0, const float centering_c = 0) {
      if (!size_x || !size_y || !size_z || !size_c) return assign();
      const unsigned int
        _sx = (unsigned int)(size_x<0?-size_x*width()/100:size_x),
        _sy = (unsigned int)(size_y<0?-size_y*height()/100:size_y),
        _sz = (unsigned int)(size_z<0?-size_z*depth()/100:size_z),
        _sc = (unsigned int)(size_c<0?-size_c*spectrum()/100:size_c),
        sx = _sx?_sx:1, sy = _sy?_sy:1, sz = _sz?_sz:1, sc = _sc?_sc:1;
      if (sx==_width && sy==_height && sz==_depth && sc==_spectrum) return *this;
      if (is_empty()) return assign(sx,sy,sz,sc,(T)0);
      if (interpolation_type==-1 && sx*sy*sz*sc==size()) {
	_width = sx; _height = sy; _depth = sz; _spectrum = sc;
	return *this;
      }
      return get_resize(sx,sy,sz,sc,interpolation_type,boundary_conditions,centering_x,centering_y,centering_z,centering_c).move_to(*this);
    }